

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

void __thiscall
tcu::anon_unknown_4::Test::check(Test *this,string *expr,double result,double reference)

{
  ostream *poVar1;
  TestError *this_00;
  char *local_1b0;
  ostringstream oss;
  
  if ((result == reference) && (!NAN(result) && !NAN(reference))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,(string *)this);
  std::operator<<(poVar1," returned ");
  poVar1 = std::ostream::_M_insert<double>(result);
  std::operator<<(poVar1,", expected ");
  std::ostream::_M_insert<double>(reference);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  TestError::TestError
            (this_00,local_1b0,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
             ,0x147);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

void Test::check (const string& expr, double result, double reference) const
{
	if (result != reference)
	{
		ostringstream oss;
		oss << expr << " returned " << result << ", expected " << reference;
		TCU_FAIL(oss.str().c_str());
	}
}